

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::
FunctionMockerBase<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
::UntypedPerformAction
          (FunctionMockerBase<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
           *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<cv::Mat> *pAVar1;
  undefined1 local_28 [8];
  Action<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  action;
  
  linked_ptr<testing::ActionInterface<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::linked_ptr((linked_ptr<testing::ActionInterface<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
                *)local_28,
               (linked_ptr<testing::ActionInterface<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
                *)untyped_action);
  pAVar1 = ActionResultHolder<cv::Mat>::PerformAction<cv::Mat(std::__cxx11::string)>
                     ((Action<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                       *)local_28,(ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
                 *)local_28);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }